

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsKrylovDemo_ls.c
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  int iVar2;
  int iVar3;
  N_Vector p_Var4;
  undefined8 uVar5;
  void *returnvalue;
  void *returnvalue_00;
  undefined8 *puVar6;
  int jx;
  long lVar7;
  void *pvVar8;
  char *funcname;
  uint uVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  int retval;
  undefined4 local_114;
  SUNContext sunctx;
  N_Vector local_108;
  void *local_100;
  void *local_f8;
  int retval_1;
  undefined4 uStack_ec;
  void *local_e8;
  long local_e0;
  SUNLogger logger;
  int qu;
  undefined4 uStack_cc;
  sunrealtype hu;
  long nst;
  uint local_b4;
  undefined8 local_b0;
  double local_a8;
  sunrealtype local_a0;
  long local_98;
  sunrealtype t;
  long nfeLS;
  long ncfl;
  long nps;
  long npe;
  long nli;
  long netf;
  long ncfn;
  long nni;
  long nsetups;
  long nfe;
  long nst_1;
  
  bVar12 = true;
  iVar2 = 0;
  if ((1 < argc) && (iVar2 = atoi(argv[1]), argc != 2)) {
    iVar3 = atoi(argv[2]);
    bVar12 = iVar3 == 0;
  }
  retval = SUNContext_Create(0,&sunctx);
  iVar3 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar3 == 0) {
    retval = SUNLogger_Create(0,0,&logger);
    iVar3 = check_retval(&retval,"SUNLogger_Create",1);
    if (iVar3 == 0) {
      if (!bVar12) {
        retval = SUNLogger_SetInfoFilename(logger,"cvKrylovDemo_ls-info.txt");
        iVar3 = check_retval(&retval,"SUNLogger_SetInfoFilename",1);
        if (iVar3 != 0) {
          return 1;
        }
      }
      retval = SUNContext_SetLogger(sunctx,logger);
      iVar3 = check_retval(&retval,"SUNContext_SetLogger",1);
      if (iVar3 == 0) {
        p_Var4 = (N_Vector)N_VNew_Serial(200,sunctx);
        iVar3 = check_retval(p_Var4,"N_VNew_Serial",0);
        if (iVar3 == 0) {
          local_108 = p_Var4;
          local_100 = malloc(0x998);
          lVar7 = (long)local_100 + 0x640;
          local_98 = lVar7;
          for (lVar10 = 0; pvVar8 = local_100, lVar10 != 10; lVar10 = lVar10 + 1) {
            for (lVar11 = 0; lVar11 != 10; lVar11 = lVar11 + 1) {
              uVar5 = SUNDlsMat_newDenseMat(2,2);
              *(undefined8 *)(lVar7 + -0x640 + lVar11 * 8) = uVar5;
              uVar5 = SUNDlsMat_newDenseMat(2,2);
              *(undefined8 *)(lVar7 + -800 + lVar11 * 8) = uVar5;
              uVar5 = SUNDlsMat_newIndexArray(2);
              *(undefined8 *)(lVar7 + lVar11 * 8) = uVar5;
            }
            lVar7 = lVar7 + 0x50;
          }
          iVar3 = check_retval(local_100,"AllocUserData",2);
          p_Var4 = local_108;
          if (iVar3 == 0) {
            *(undefined8 *)((long)pvVar8 + 0x968) = 0x3f13104b57cf96af;
            *(undefined8 *)((long)pvVar8 + 0x970) = 0x4001c71c71c71c72;
            *(undefined8 *)((long)pvVar8 + 0x978) = 0x4001c71c71c71c72;
            *(undefined8 *)((long)pvVar8 + 0x980) = 0x3eab2dd8d6457178;
            *(undefined8 *)((long)pvVar8 + 0x988) = 0x3f2d7dbf487fcb92;
            *(undefined8 *)((long)pvVar8 + 0x990) = 0x3e216505a7da8610;
            SetInitialProfiles(local_108,2.2222222222222223,2.2222222222222223);
            returnvalue = (void *)CVodeCreate(2,sunctx);
            local_f8 = returnvalue;
            iVar3 = check_retval(returnvalue,"CVodeCreate",0);
            if (iVar3 == 0) {
              retval = CVodeSetUserData(returnvalue,pvVar8);
              iVar3 = check_retval(&retval,"CVodeSetUserData",1);
              if (iVar3 == 0) {
                retval = CVodeInit(0,returnvalue,f,p_Var4);
                iVar3 = check_retval(&retval,"CVodeInit",1);
                if (iVar3 == 0) {
                  retval = CVodeSStolerances(0x88e368f1,0x3f50624dd2f1a9fc,returnvalue);
                  iVar3 = check_retval(&retval,"CVodeSStolerances",1);
                  if (iVar3 == 0) {
                    local_b0 = SUNNonlinSol_Newton(p_Var4,sunctx);
                    retval = CVodeSetNonlinearSolver(returnvalue,local_b0);
                    iVar3 = check_retval(&retval,"CVodeSetNonlinearSolver",1);
                    if (iVar3 == 0) {
                      if (iVar2 == 2) {
                        uVar9 = 0xbff00000;
                      }
                      else {
                        uVar9 = 0;
                      }
                      local_e0 = (ulong)uVar9 << 0x20;
                      if (iVar2 == 1) {
                        local_e0 = 0x402c48c6001f0ac0;
                      }
                      local_e8 = (void *)0x0;
                      uVar9 = 0;
                      pvVar8 = local_100;
                      p_Var4 = local_108;
                      do {
                        local_b4 = uVar9;
                        if (uVar9 == 0) {
                          SUNLinSolFree(local_e8);
                          printf(" -------");
                          puts(" \n| SPGMR |");
                          puts(" -------");
                          returnvalue_00 = (void *)SUNLinSol_SPGMR(p_Var4,1,0,sunctx);
                          iVar2 = check_retval(returnvalue_00,"SUNLinSol_SPGMR",0);
                          returnvalue = local_f8;
                          if (iVar2 != 0) {
                            return 1;
                          }
                          retval = CVodeSetLinearSolver(local_f8,returnvalue_00,0);
                          iVar2 = check_retval(&retval,"CVodeSetLinearSolver",1);
                        }
                        else {
                          if (uVar9 == 4) {
                            N_VDestroy(p_Var4);
                            lVar7 = local_98;
                            for (lVar10 = 0; lVar10 != 10; lVar10 = lVar10 + 1) {
                              for (lVar11 = 0; lVar11 != 10; lVar11 = lVar11 + 1) {
                                SUNDlsMat_destroyMat(*(undefined8 *)(lVar7 + -0x640 + lVar11 * 8));
                                SUNDlsMat_destroyMat(*(undefined8 *)(lVar7 + -800 + lVar11 * 8));
                                SUNDlsMat_destroyArray(*(undefined8 *)(lVar7 + lVar11 * 8));
                              }
                              lVar7 = lVar7 + 0x50;
                            }
                            free(local_100);
                            CVodeFree(&local_f8);
                            SUNLinSolFree(local_e8);
                            SUNNonlinSolFree(local_b0);
                            SUNLogger_Destroy(&logger);
                            SUNContext_Free(&sunctx);
                            return 0;
                          }
                          *(undefined8 *)((long)pvVar8 + 0x968) = 0x3f13104b57cf96af;
                          *(undefined8 *)((long)pvVar8 + 0x970) = 0x4001c71c71c71c72;
                          *(undefined8 *)((long)pvVar8 + 0x978) = 0x4001c71c71c71c72;
                          *(undefined8 *)((long)pvVar8 + 0x980) = 0x3eab2dd8d6457178;
                          *(undefined8 *)((long)pvVar8 + 0x988) = 0x3f2d7dbf487fcb92;
                          *(undefined8 *)((long)pvVar8 + 0x990) = 0x3e216505a7da8610;
                          SetInitialProfiles(p_Var4,2.2222222222222223,2.2222222222222223);
                          retval = CVodeReInit(0,returnvalue,p_Var4);
                          iVar2 = check_retval(&retval,"CVodeReInit",1);
                          if (iVar2 != 0) {
                            return 1;
                          }
                          SUNLinSolFree(local_e8);
                          if (uVar9 == 1) {
                            printf(" ---------");
                            puts(" \n| SPFGMR |");
                            puts(" ---------");
                            returnvalue_00 = (void *)SUNLinSol_SPFGMR(p_Var4,1,0,sunctx);
                            funcname = "SUNLinSol_SPFGMR";
                          }
                          else if (uVar9 == 2) {
                            printf(" -------");
                            puts(" \n| SPBCGS |");
                            puts(" -------");
                            returnvalue_00 = (void *)SUNLinSol_SPBCGS(p_Var4,1,0,sunctx);
                            funcname = "SUNLinSol_SPBCGS";
                          }
                          else {
                            printf(" ---------");
                            puts(" \n| SPTFQMR |");
                            puts(" ---------");
                            returnvalue_00 = (void *)SUNLinSol_SPTFQMR(p_Var4,1,0,sunctx);
                            funcname = "SUNLinSol_SPTFQMR";
                          }
                          iVar2 = check_retval(returnvalue_00,funcname,0);
                          returnvalue = local_f8;
                          if (iVar2 != 0) {
                            return 1;
                          }
                          retval = CVodeSetLinearSolver(local_f8,returnvalue_00,0);
                          iVar2 = check_retval(&retval,"CVodeSetLinearSolver",1);
                          pvVar8 = local_100;
                          p_Var4 = local_108;
                        }
                        if (iVar2 != 0) {
                          return 1;
                        }
                        retval = CVodeSetPreconditioner(returnvalue,Precond,PSolve);
                        iVar2 = check_retval(&retval,"CVodeSetPreconditioner",1);
                        if (iVar2 != 0) {
                          return 1;
                        }
                        local_e8 = returnvalue_00;
                        retval = CVodeSetLSNormFactor((int)local_e0,returnvalue);
                        iVar2 = check_retval(&retval,"CVodeSetLSNormFactor",1);
                        if (iVar2 != 0) {
                          return 1;
                        }
                        puts(" \n2-species diurnal advection-diffusion problem\n");
                        iVar2 = 0xc;
                        dVar1 = 7200.0;
                        while (bVar12 = iVar2 != 0, iVar2 = iVar2 + -1, bVar12) {
                          local_a8 = dVar1;
                          retval = CVode(returnvalue,p_Var4,&t,1);
                          returnvalue = local_f8;
                          local_a0 = t;
                          puVar6 = (undefined8 *)N_VGetArrayPointer(p_Var4);
                          retval_1 = CVodeGetNumSteps(returnvalue,&nst);
                          check_retval(&retval_1,"CVodeGetNumSteps",1);
                          retval_1 = CVodeGetLastOrder(returnvalue,&qu);
                          check_retval(&retval_1,"CVodeGetLastOrder",1);
                          retval_1 = CVodeGetLastStep(returnvalue,&hu);
                          check_retval(&retval_1,"CVodeGetLastStep",1);
                          printf("t = %.2e   no. steps = %ld   order = %d   stepsize = %.2e\n",
                                 SUB84(local_a0,0),hu,nst,(ulong)(uint)qu);
                          printf("c1 (bot.left/middle/top rt.) = %12.3e  %12.3e  %12.3e\n",
                                 (int)*puVar6,puVar6[0x58],puVar6[0xc6]);
                          printf("c2 (bot.left/middle/top rt.) = %12.3e  %12.3e  %12.3e\n\n",
                                 (int)puVar6[1],puVar6[0x59],puVar6[199]);
                          iVar3 = check_retval(&retval,"CVode",1);
                          p_Var4 = local_108;
                          if (iVar3 != 0) break;
                          dVar1 = local_a8 + 7200.0;
                        }
                        local_114 = CVodeGetWorkSpace(returnvalue,&nst,&hu);
                        check_retval(&local_114,"CVodeGetWorkSpace",1);
                        local_114 = CVodeGetNumSteps(returnvalue,&nst_1);
                        check_retval(&local_114,"CVodeGetNumSteps",1);
                        local_114 = CVodeGetNumRhsEvals(returnvalue,&nfe);
                        check_retval(&local_114,"CVodeGetNumRhsEvals",1);
                        local_114 = CVodeGetNumLinSolvSetups(returnvalue,&nsetups);
                        check_retval(&local_114,"CVodeGetNumLinSolvSetups",1);
                        local_114 = CVodeGetNumErrTestFails(returnvalue,&netf);
                        check_retval(&local_114,"CVodeGetNumErrTestFails",1);
                        local_114 = CVodeGetNumNonlinSolvIters(returnvalue,&nni);
                        check_retval(&local_114,"CVodeGetNumNonlinSolvIters",1);
                        local_114 = CVodeGetNumNonlinSolvConvFails(returnvalue,&ncfn);
                        check_retval(&local_114,"CVodeGetNumNonlinSolvConvFails",1);
                        local_114 = CVodeGetLinWorkSpace(returnvalue,&qu,&retval_1);
                        check_retval(&local_114,"CVodeGetLinWorkSpace",1);
                        local_114 = CVodeGetNumLinIters(returnvalue,&nli);
                        check_retval(&local_114,"CVodeGetNumLinIters",1);
                        local_114 = CVodeGetNumPrecEvals(returnvalue,&npe);
                        check_retval(&local_114,"CVodeGetNumPrecEvals",1);
                        local_114 = CVodeGetNumPrecSolves(returnvalue,&nps);
                        check_retval(&local_114,"CVodeGetNumPrecSolves",1);
                        local_114 = CVodeGetNumLinConvFails(returnvalue,&ncfl);
                        check_retval(&local_114,"CVodeGetNumLinConvFails",1);
                        local_114 = CVodeGetNumLinRhsEvals(returnvalue,&nfeLS);
                        check_retval(&local_114,"CVodeGetNumLinRhsEvals",1);
                        puts("\nFinal Statistics.. \n");
                        printf("lenrw   = %5ld     leniw   = %5ld\n",nst,hu);
                        printf("lenrwLS = %5ld     leniwLS = %5ld\n",CONCAT44(uStack_cc,qu),
                               CONCAT44(uStack_ec,retval_1));
                        printf("nst     = %5ld\n",nst_1);
                        printf("nfe     = %5ld     nfeLS   = %5ld\n",nfe,nfeLS);
                        printf("nni     = %5ld     nli     = %5ld\n",nni,nli);
                        printf("nsetups = %5ld     netf    = %5ld\n",nsetups,netf);
                        printf("npe     = %5ld     nps     = %5ld\n",npe,nps);
                        printf("ncfn    = %5ld     ncfl    = %5ld\n\n",ncfn,ncfl);
                        uVar9 = local_b4;
                        if (local_b4 < 2) {
                          puts(
                              "======================================================================\n"
                              );
                        }
                        uVar9 = uVar9 + 1;
                      } while( true );
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  sunrealtype abstol, reltol, t, tout;
  N_Vector u;
  UserData data;
  SUNLinearSolver LS;
  SUNNonlinearSolver NLS;
  void* cvode_mem;
  int linsolver, iout, retval;
  int nrmfactor;      /* LS norm conversion factor flag */
  sunrealtype nrmfac; /* LS norm conversion factor      */
  int monitor;        /* LS resiudal monitoring flag    */
  SUNContext sunctx;
  SUNLogger logger;
  const char* info_fname = "cvKrylovDemo_ls-info.txt";

  u         = NULL;
  data      = NULL;
  LS        = NULL;
  cvode_mem = NULL;
  nrmfactor = 0;
  monitor   = 0;

  /* Retrieve the command-line options */
  if (argc > 1) { nrmfactor = atoi(argv[1]); }
  if (argc > 2) { monitor = atoi(argv[2]); }

  /* Create SUNDIALS context and a logger which will record
     nonlinear solver info (e.g., residual) amongst other things. */

  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  retval = SUNLogger_Create(SUN_COMM_NULL, 0, &logger);
  if (check_retval(&retval, "SUNLogger_Create", 1)) { return 1; }

  if (monitor)
  {
    retval = SUNLogger_SetInfoFilename(logger, info_fname);
    if (check_retval(&retval, "SUNLogger_SetInfoFilename", 1)) { return 1; }
  }

  retval = SUNContext_SetLogger(sunctx, logger);
  if (check_retval(&retval, "SUNContext_SetLogger", 1)) { return 1; }

  /* Allocate memory, and set problem data, initial values, tolerances */
  u = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)u, "N_VNew_Serial", 0)) { return (1); }
  data = AllocUserData();
  if (check_retval((void*)data, "AllocUserData", 2)) { return (1); }
  InitUserData(data);
  SetInitialProfiles(u, data->dx, data->dy);
  abstol = ATOL;
  reltol = RTOL;

  /* Call CVodeCreate to create the solver memory and specify the
   * Backward Differentiation Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Set the pointer to user-defined data */
  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Call CVodeInit to initialize the integrator memory and specify the
   * user's right hand side function in u'=f(t,u), the inital time T0, and
   * the initial dependent variable vector u. */
  retval = CVodeInit(cvode_mem, f, T0, u);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeSStolerances to specify the scalar relative tolerance
   * and scalar absolute tolerances */
  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Create the SUNNonlinearSolver */
  NLS = SUNNonlinSol_Newton(u, sunctx);
  if (check_retval(&retval, "SUNNonlinSol_Newton", 0)) { return (1); }

  /* Call CVodeSetNonlinearSolver to attach the nonlinear solver to CVode */
  retval = CVodeSetNonlinearSolver(cvode_mem, NLS);
  if (check_retval(&retval, "CVodeSetNonlinearSolver", 1)) { return (1); }

  /* START: Loop through SPGMR, SPFGMR, SPBCG and SPTFQMR linear solver modules */
  for (linsolver = 0; linsolver < 4; ++linsolver)
  {
    if (linsolver != 0)
    {
      /* Re-initialize user data */
      InitUserData(data);
      SetInitialProfiles(u, data->dx, data->dy);

      /* Re-initialize CVode for the solution of the same problem, but
       using a different linear solver module */
      retval = CVodeReInit(cvode_mem, T0, u);
      if (check_retval(&retval, "CVodeReInit", 1)) { return (1); }
    }

    /* Free previous linear solver and attach a new linear solver module */
    SUNLinSolFree(LS);

    switch (linsolver)
    {
    /* (a) SPGMR */
    case (USE_SPGMR):

      /* Print header */
      printf(" -------");
      printf(" \n| SPGMR |\n");
      printf(" -------\n");

      /* Call SUNLinSol_SPGMR to specify the linear solver SPGMR with
         left preconditioning and the default maximum Krylov dimension */
      LS = SUNLinSol_SPGMR(u, SUN_PREC_LEFT, 0, sunctx);
      if (check_retval((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

      retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
      if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

      break;

    /* (b) SPFGMR */
    case (USE_SPFGMR):

      /* Print header */
      printf(" ---------");
      printf(" \n| SPFGMR |\n");
      printf(" ---------\n");

      /* Call SUNLinSol_SPFGMR to specify the linear solver SPFGMR with
         left preconditioning and the default maximum Krylov dimension */
      LS = SUNLinSol_SPFGMR(u, SUN_PREC_LEFT, 0, sunctx);
      if (check_retval((void*)LS, "SUNLinSol_SPFGMR", 0)) { return (1); }

      retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
      if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

      break;

    /* (c) SPBCG */
    case (USE_SPBCG):

      /* Print header */
      printf(" -------");
      printf(" \n| SPBCGS |\n");
      printf(" -------\n");

      /* Call SUNLinSol_SPBCGS to specify the linear solver SPBCGS with
         left preconditioning and the default maximum Krylov dimension */
      LS = SUNLinSol_SPBCGS(u, SUN_PREC_LEFT, 0, sunctx);
      if (check_retval((void*)LS, "SUNLinSol_SPBCGS", 0)) { return (1); }

      retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
      if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

      break;

    /* (d) SPTFQMR */
    case (USE_SPTFQMR):

      /* Print header */
      printf(" ---------");
      printf(" \n| SPTFQMR |\n");
      printf(" ---------\n");

      /* Call SUNLinSol_SPTFQMR to specify the linear solver SPTFQMR with
         left preconditioning and the default maximum Krylov dimension */
      LS = SUNLinSol_SPTFQMR(u, SUN_PREC_LEFT, 0, sunctx);
      if (check_retval((void*)LS, "SUNLinSol_SPTFQMR", 0)) { return (1); }

      retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
      if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

      break;
    }

    /* Set preconditioner setup and solve routines Precond and PSolve,
       and the pointer to the user-defined block data */
    retval = CVodeSetPreconditioner(cvode_mem, Precond, PSolve);
    if (check_retval(&retval, "CVodeSetPreconditioner", 1)) { return (1); }

    /* Set the linear solver tolerance conversion factor */
    switch (nrmfactor)
    {
    case (1):
      /* use the square root of the vector length */
      nrmfac = SQRT((sunrealtype)NEQ);
      break;
    case (2):
      /* compute with dot product */
      nrmfac = -ONE;
      break;
    default:
      /* use the default */
      nrmfac = ZERO;
      break;
    }

    retval = CVodeSetLSNormFactor(cvode_mem, nrmfac);
    if (check_retval(&retval, "CVodeSetLSNormFactor", 1)) { return (1); }

    /* In loop over output points, call CVode, print results, and test for error */
    printf(" \n2-species diurnal advection-diffusion problem\n\n");
    for (iout = 1, tout = TWOHR; iout <= NOUT; iout++, tout += TWOHR)
    {
      retval = CVode(cvode_mem, tout, u, &t, CV_NORMAL);
      PrintOutput(cvode_mem, u, t);
      if (check_retval(&retval, "CVode", 1)) { break; }
    }

    PrintFinalStats(cvode_mem, linsolver);

  } /* END: Loop through SPGMR, SPBCG and SPTFQMR linear solver modules */

  /* Free memory */
  N_VDestroy(u);
  FreeUserData(data);
  CVodeFree(&cvode_mem);
  SUNLinSolFree(LS);
  SUNNonlinSolFree(NLS);
  SUNLogger_Destroy(&logger);
  SUNContext_Free(&sunctx);

  return (0);
}